

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TestChecks.cpp
# Opt level: O1

void __thiscall
anon_unknown.dwarf_1482a::TestCheckArray2DCloseFailureIncludesDetails::RunImpl
          (TestCheckArray2DCloseFailureIncludesDetails *this)

{
  TestResults *pTVar1;
  TestResults **ppTVar2;
  TestDetails **ppTVar3;
  TestResults results;
  TestDetails details;
  float array2 [3] [3];
  float array1 [3] [3];
  RecordingReporter reporter;
  TestDetails local_8f8;
  int local_8d4;
  TestResults local_8d0;
  TestDetails local_8b8;
  float local_898 [2];
  undefined1 auStack_890 [16];
  float afStack_880 [6];
  float local_868 [2];
  undefined1 auStack_860 [16];
  float afStack_850 [6];
  TestReporter local_838;
  undefined4 local_830;
  undefined1 local_82c;
  undefined1 local_72c;
  undefined4 local_62c;
  char local_628 [256];
  int local_528;
  char local_524 [256];
  char local_424 [256];
  undefined1 local_324;
  undefined4 local_224;
  undefined1 local_220;
  undefined1 local_120;
  undefined8 local_20;
  undefined8 uStack_18;
  undefined4 local_10;
  
  local_838._vptr_TestReporter = (_func_int **)&PTR__TestReporter_00150810;
  local_830 = 0;
  local_62c = 0;
  local_528 = 0;
  local_224 = 0;
  local_82c = 0;
  local_72c = 0;
  local_628[0] = '\0';
  local_524[0] = '\0';
  local_424[0] = '\0';
  local_324 = 0;
  local_220 = 0;
  local_120 = 0;
  local_20 = 0;
  uStack_18 = 0;
  local_10 = 0;
  UnitTest::TestResults::TestResults(&local_8d0,&local_838);
  UnitTest::TestDetails::TestDetails(&local_8b8,"array2DCloseTest","array2DCloseSuite","file",0x4d2)
  ;
  auStack_860._8_4_ = 2.5;
  auStack_860._12_4_ = 3.0;
  afStack_850[0] = 3.0;
  afStack_850[1] = 3.5;
  local_868[0] = 1.0;
  local_868[1] = 1.5;
  auStack_860._0_4_ = 2.0;
  auStack_860._4_4_ = 2.0;
  afStack_850[2] = 4.0;
  auStack_890._8_4_ = 2.51;
  auStack_890._12_4_ = 3.01;
  afStack_880[0] = 3.01;
  afStack_880[1] = 3.51;
  local_898[0] = 1.01;
  local_898[1] = 1.51;
  auStack_890._0_4_ = 2.01;
  auStack_890._4_4_ = 2.01;
  afStack_880[2] = 4.01;
  local_8f8.suiteName._0_4_ = 0x3a83126f;
  UnitTest::CheckArray2DClose<float[3][3],float[3][3],float>
            (&local_8d0,(float (*) [3] [3])local_868,(float (*) [3] [3])local_898,3,3,
             (float *)&local_8f8,&local_8b8);
  ppTVar2 = UnitTest::CurrentTest::Results();
  pTVar1 = *ppTVar2;
  ppTVar3 = UnitTest::CurrentTest::Details();
  UnitTest::TestDetails::TestDetails(&local_8f8,*ppTVar3,0x11f);
  UnitTest::CheckEqual(pTVar1,"array2DCloseTest",local_424,&local_8f8);
  ppTVar2 = UnitTest::CurrentTest::Results();
  pTVar1 = *ppTVar2;
  ppTVar3 = UnitTest::CurrentTest::Details();
  UnitTest::TestDetails::TestDetails(&local_8f8,*ppTVar3,0x120);
  UnitTest::CheckEqual(pTVar1,"array2DCloseSuite",local_524,&local_8f8);
  ppTVar2 = UnitTest::CurrentTest::Results();
  pTVar1 = *ppTVar2;
  ppTVar3 = UnitTest::CurrentTest::Details();
  UnitTest::TestDetails::TestDetails(&local_8f8,*ppTVar3,0x121);
  UnitTest::CheckEqual(pTVar1,"file",local_628,&local_8f8);
  ppTVar2 = UnitTest::CurrentTest::Results();
  pTVar1 = *ppTVar2;
  local_8d4 = 0x4d2;
  ppTVar3 = UnitTest::CurrentTest::Details();
  UnitTest::TestDetails::TestDetails(&local_8f8,*ppTVar3,0x122);
  UnitTest::CheckEqual<int,int>(pTVar1,&local_8d4,&local_528,&local_8f8);
  UnitTest::TestReporter::~TestReporter(&local_838);
  return;
}

Assistant:

TEST(CheckEqualsWithStringsFailsOnDifferentStrings)
{
    char txt1[] = "Hello";
    char txt2[] = "Hallo";
    TestResults results;
    CheckEqual(results, txt1, txt2, TestDetails("", "", "", 0));
    CHECK_EQUAL(1, results.GetFailureCount());
}